

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall Liby::TimerQueue::handleTimeoutEvents(TimerQueue *this)

{
  BinaryHeap<Liby::WeakTimerHolder> *this_00;
  _Atomic_word *p_Var1;
  int iVar2;
  size_type_conflict sVar3;
  pointer pWVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  Logger *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar8;
  bool bVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Timestamp now;
  timeval local_48;
  
  if (this->poller_ == (Poller *)0x0) {
    __assert_fail("poller_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp"
                  ,0x53,"void Liby::TimerQueue::handleTimeoutEvents()");
  }
  if ((this->queue_).size_ != 0) {
    this_00 = &this->queue_;
    local_48.tv_sec = 0;
    local_48.tv_usec = 0;
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    sVar3 = this_00->size_;
    while (sVar3 != 0) {
      pWVar4 = (this->queue_).heap.
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar9 = true;
      lVar5 = pWVar4[1].timer_.timeout_.tv_.tv_sec;
      if ((lVar5 <= local_48.tv_sec) &&
         ((lVar5 < local_48.tv_sec || (pWVar4[1].timer_.timeout_.tv_.tv_usec <= local_48.tv_usec))))
      {
        p_Var6 = pWVar4[1].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        bVar9 = true;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar9 = p_Var6->_M_use_count == 0;
          }
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &p_Var6->_M_weak_count;
            iVar7 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar7 = p_Var6->_M_weak_count;
            p_Var6->_M_weak_count = iVar7 + -1;
          }
          if (iVar7 == 1) {
            (*p_Var6->_vptr__Sp_counted_base[3])();
          }
        }
        if (!bVar9) {
          peVar8 = pWVar4[1].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var6 = pWVar4[1].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          this_02 = p_Var6;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
            }
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar7 = p_Var6->_M_use_count;
              do {
                if (iVar7 == 0) {
                  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar2 = p_Var6->_M_use_count;
                bVar9 = iVar7 == iVar2;
                if (bVar9) {
                  p_Var6->_M_use_count = iVar7 + 1;
                  iVar2 = iVar7;
                }
                iVar7 = iVar2;
                UNLOCK();
              } while (!bVar9);
            }
          }
          if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            peVar8 = (element_type *)0x0;
          }
          else if (this_02->_M_use_count == 0) {
            peVar8 = (element_type *)0x0;
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &p_Var6->_M_weak_count;
              iVar7 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar7 = p_Var6->_M_weak_count;
              p_Var6->_M_weak_count = iVar7 + -1;
            }
            if (iVar7 == 1) {
              (*p_Var6->_vptr__Sp_counted_base[3])();
            }
          }
          if ((peVar8->handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(peVar8->handler_)._M_invoker)((_Any_data *)&peVar8->handler_);
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
        }
        this_01 = Logger::getLogger();
        bVar9 = false;
        Logger::log(this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        BinaryHeap<Liby::WeakTimerHolder>::delete_min(this_00);
      }
      if (bVar9) break;
      sVar3 = this_00->size_;
    }
    if (this_00->size_ != 0) {
      updateTimerfd(this,&(this->queue_).heap.
                          super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].timer_.timeout_);
    }
  }
  return;
}

Assistant:

void TimerQueue::handleTimeoutEvents() {
    assert(poller_);
    if (queue_.empty()) {
        return;
    }

    auto now = Timestamp::now();
    while (!queue_.empty()) {
        WeakTimerHolder &weak_holder = queue_.find_min();
        Timer &minTimer = weak_holder.getTimer();
        if (now < minTimer.timeout()) {
            break;
        }

        if (!weak_holder.getWeakTimerPtr().expired()) {
            std::shared_ptr<Timer> TimerPtr =
                weak_holder.getWeakTimerPtr().lock();
            TimerPtr->runHandler();
        }
        verbose("delete timer id = %lu\n", minTimer.id());
        queue_.delete_min();
    }
    if (!queue_.empty()) {
        updateTimerfd(queue_.find_min().getTimer().timeout());
    }
}